

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xoshiro256plus.hpp
# Opt level: O1

void __thiscall trng::xoshiro256plus::jump(xoshiro256plus *this,unsigned_long_long s)

{
  GF2 *__cur;
  ulong uVar1;
  void *pvVar2;
  int j;
  ulong uVar3;
  unsigned_long_long m;
  long lVar4;
  ulong uVar5;
  result_type rVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  int i;
  anon_class_16_2_94731e0a f;
  vector<trng::GF2,_256UL> v0;
  matrix<trng::GF2,_256UL> M;
  vector<trng::GF2,_256UL> v1;
  xoshiro256plus local_a8;
  void *local_88;
  void *pvStack_80;
  long local_78;
  status_type local_68;
  matrix<trng::GF2,_256UL> local_48;
  
  if (s < 0x10) {
    if (s != 0) {
      uVar1 = (this->S).r[0];
      uVar7 = (this->S).r[1];
      uVar5 = (this->S).r[2];
      uVar3 = (this->S).r[3];
      uVar9 = 0;
      do {
        uVar10 = uVar7 << 0x11;
        uVar5 = uVar5 ^ uVar1;
        uVar3 = uVar3 ^ uVar7;
        uVar7 = uVar7 ^ uVar5;
        uVar1 = uVar1 ^ uVar3;
        uVar5 = uVar5 ^ uVar10;
        uVar3 = uVar3 << 0x2d | uVar3 >> 0x13;
        uVar9 = uVar9 + 1;
      } while (uVar9 < (uint)s);
      (this->S).r[1] = uVar7;
      (this->S).r[2] = uVar5;
      (this->S).r[3] = uVar3;
      (this->S).r[0] = uVar1;
    }
  }
  else {
    local_88 = (void *)0x0;
    pvStack_80 = (void *)0x0;
    local_78 = 0;
    local_88 = operator_new(0x10000);
    lVar4 = (long)local_88 + 0x10000;
    uVar1 = 0;
    pvStack_80 = local_88;
    local_78 = lVar4;
    memset(local_88,0,0x10000);
    pvStack_80 = (void *)lVar4;
    do {
      xoshiro256plus(&local_a8);
      status_type::status_type(&local_68,uVar1 & 0xffffffff);
      local_a8.S.r[1] = local_68.r[2] ^ local_68.r[0] ^ local_68.r[1];
      uVar7 = local_68.r[1] ^ local_68.r[3];
      local_a8.S.r[0] = local_68.r[0] ^ uVar7;
      local_a8.S.r[2] = local_68.r[2] ^ local_68.r[0] ^ local_68.r[1] << 0x11;
      local_a8.S.r[3] = uVar7 << 0x2d | uVar7 >> 0x13;
      status_type::to_vector((vector<trng::GF2,_256UL> *)&local_68,&local_a8.S);
      m = 0;
      uVar7 = uVar1;
      do {
        *(undefined1 *)((long)local_88 + uVar7) = *(undefined1 *)(local_68.r[0] + m);
        m = m + 1;
        uVar7 = uVar7 + 0x100;
      } while (m != 0x100);
      if ((void *)local_68.r[0] != (void *)0x0) {
        operator_delete((void *)local_68.r[0]);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != 0x100);
    status_type::to_vector((vector<trng::GF2,_256UL> *)&local_a8,&this->S);
    power<trng::GF2,256ul>(&local_48,(trng *)&local_88,(matrix<trng::GF2,_256UL> *)s,m);
    f.b = (vector<trng::GF2,_256UL> *)&local_a8;
    f.a = &local_48;
    vector<trng::GF2,256ul>::operator*((vector<trng::GF2,256ul> *)&local_68,f);
    if (local_48.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    lVar4 = 0;
    pvVar2 = (void *)local_68.r[0];
    do {
      lVar8 = 0;
      rVar6 = 0;
      do {
        rVar6 = (ulong)(*(char *)((long)pvVar2 + lVar8) != '\0') + rVar6 * 2;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x40);
      (this->S).r[lVar4] = rVar6;
      lVar4 = lVar4 + 1;
      pvVar2 = (void *)((long)pvVar2 + 0x40);
    } while (lVar4 != 4);
    if ((void *)local_68.r[0] != (void *)0x0) {
      operator_delete((void *)local_68.r[0]);
    }
    if ((void *)local_a8.S.r[0] != (void *)0x0) {
      operator_delete((void *)local_a8.S.r[0]);
    }
    if (local_88 != (void *)0x0) {
      operator_delete(local_88);
    }
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void xoshiro256plus::jump(unsigned long long s) {
    if (s < 16) {
      for (unsigned int i{0}; i < s; ++i)
        step();
    } else {
      matrix<GF2, 256> M;
      for (int i{0}; i < 256; ++i) {
        xoshiro256plus R;
        R.S = status_type(i, status_type::eye{});
        R.step();
        const vector<GF2, 256> v{R.S.to_vector()};
        for (int j{0}; j < 256; ++j)
          M(j, i) = v(j);
      }

      const vector<GF2, 256> v0{S.to_vector()};
      const vector<GF2, 256> v1{power(M, s) * v0};

      for (int j{0}; j < 4; ++j) {
        result_type r_j{0};
        for (int i{0}; i < 64; ++i) {
          r_j <<= 1;
          if (static_cast<bool>(v1(i + 64 * j)))
            r_j |= 1;
        }
        S.r[j] = r_j;
      }
    }
  }